

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_decorator.hpp
# Opt level: O2

void __thiscall ftxui::NodeDecorator::NodeDecorator(NodeDecorator *this,Element *child)

{
  shared_ptr<ftxui::Node> *in_RDX;
  Elements local_40;
  element_type *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  local_28 = (child->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  a_Stack_20[0]._M_pi =
       (child->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (child->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (child->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  unpack<std::shared_ptr<ftxui::Node>>(&local_40,(ftxui *)&local_28,in_RDX);
  Node::Node(&this->super_Node,&local_40);
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            (&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_20);
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__Node_00169690;
  return;
}

Assistant:

NodeDecorator(Element child) : Node(unpack(std::move(child))) {}